

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<long_long_()>::UntypedPerformAction
          (FunctionMockerBase<long_long_()> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<long_long> *pAVar1;
  Action<long_long_()> *in_RDX;
  ArgumentTuple *args;
  Action<long_long_()> action;
  Action<long_long_()> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<long_long_()> local_28;
  Action<long_long_()> *local_18;
  
  local_18 = in_RDX;
  Action<long_long_()>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<long_long>::PerformAction<long_long()>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<long_long_()>::~Action((Action<long_long_()> *)0x1b35c1);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }